

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_play_item(command *cmd)

{
  wchar_t *pwVar1;
  bitflag *pbVar2;
  cmd_code c;
  object *poVar3;
  _Bool _Var4;
  int16_t iVar5;
  int16_t iVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  errr eVar9;
  command_conflict *pcVar10;
  command *cmd_00;
  byte bVar11;
  char *pcVar12;
  char *pcVar13;
  object *obj;
  wchar_t object_changed;
  char ch;
  wchar_t display_all_prop;
  object *orig_obj;
  object *local_38;
  object *poStack_30;
  
  obj = (object *)0x0;
  orig_obj = (object *)0x0;
  display_all_prop = L'\x01';
  object_changed = L'\0';
  wVar7 = cmd_get_arg_item((command_conflict *)cmd,"original_item",&orig_obj);
  poVar3 = orig_obj;
  wVar8 = cmd_get_arg_item((command_conflict *)cmd,"item",&obj);
  if ((wVar7 == L'\0') && (poVar3 != (object *)0x0)) {
    if (obj == (object *)0x0 || wVar8 != L'\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/cmd-wizard.c"
                    ,0x681,"void do_cmd_wiz_play_item(struct command *)");
    }
    wVar7 = cmd_get_arg_choice((command_conflict *)cmd,"all_prop",&display_all_prop);
    if (wVar7 != L'\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/cmd-wizard.c"
                    ,0x686,"void do_cmd_wiz_play_item(struct command *)");
    }
    wVar7 = cmd_get_arg_choice((command_conflict *)cmd,"changed",&object_changed);
    if (wVar7 != L'\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/cmd-wizard.c"
                    ,0x68b,"void do_cmd_wiz_play_item(struct command *)");
    }
  }
  else {
    if ((obj == (object *)0x0 || wVar8 != L'\0') &&
       (_Var4 = get_item(&obj,"Play with which object? ","You have nothing to play with.",cmd->code,
                         (item_tester)0x0,L'\x0f'), !_Var4)) {
      return;
    }
    cmd_set_arg_item((command_conflict *)cmd,"item",obj);
    orig_obj = object_new();
    object_copy(orig_obj,obj);
    cmd_set_arg_item((command_conflict *)cmd,"original_item",orig_obj);
    wVar7 = cmd_get_arg_choice((command_conflict *)cmd,"all_prop",&display_all_prop);
    if (wVar7 != L'\0') {
      display_all_prop = L'\x01';
      cmd_set_arg_choice((command_conflict *)cmd,"all_prop",L'\x01');
    }
    wVar7 = cmd_get_arg_choice((command_conflict *)cmd,"changed",&object_changed);
    if (wVar7 != L'\0') {
      object_changed = L'\0';
      cmd_set_arg_choice((command_conflict *)cmd,"changed",L'\0');
    }
    screen_save();
  }
  wiz_display_item(obj,display_all_prop != L'\0',player);
  _Var4 = get_com("[a]ccept [s]tatistics [r]eroll [t]weak [c]urse [q]uantity [k]nown? ",&ch);
  if (!_Var4) {
    pcVar12 = "Changes ignored.";
    goto LAB_00133f36;
  }
  switch(ch) {
  case 'K':
switchD_00133f24_caseD_6b:
    wVar7 = (wchar_t)(display_all_prop == L'\0');
    pcVar12 = "all_prop";
    cmd_00 = cmd;
    display_all_prop = wVar7;
    goto LAB_00134118;
  case 'L':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
    goto switchD_00133f24_caseD_6c;
  case 'Q':
switchD_00133f24_caseD_71:
    c = CMD_WIZ_CHANGE_ITEM_QUANTITY;
    break;
  case 'R':
switchD_00133f24_caseD_72:
    c = CMD_WIZ_REROLL_ITEM;
    break;
  case 'S':
switchD_00133f24_caseD_73:
    eVar9 = cmdq_push(CMD_WIZ_STAT_ITEM);
    if (eVar9 == 0) {
      pcVar10 = cmdq_peek();
      cmd_set_arg_item(pcVar10,"item",obj);
      goto switchD_00133f24_caseD_6c;
    }
    goto LAB_001340c9;
  case 'T':
switchD_00133f24_caseD_74:
    c = CMD_WIZ_TWEAK_ITEM;
    break;
  default:
    switch(ch) {
    case 'k':
      goto switchD_00133f24_caseD_6b;
    case 'l':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
      goto switchD_00133f24_caseD_6c;
    case 'q':
      goto switchD_00133f24_caseD_71;
    case 'r':
      goto switchD_00133f24_caseD_72;
    case 's':
      goto switchD_00133f24_caseD_73;
    case 't':
      goto switchD_00133f24_caseD_74;
    default:
      if (ch == 'A') {
LAB_00133f8c:
        if (object_changed != L'\0') {
          _Var4 = object_is_carried(player,obj);
          if (_Var4) {
            bVar11 = orig_obj->number;
            if (obj->number == bVar11) {
              iVar5 = object_weight_one(obj);
              iVar6 = object_weight_one(orig_obj);
              if (iVar5 == iVar6) goto LAB_0013401f;
              bVar11 = orig_obj->number;
            }
            iVar5 = object_weight_one(orig_obj);
            pwVar1 = &player->upkeep->total_weight;
            *pwVar1 = *pwVar1 - (int)iVar5 * (uint)bVar11;
            bVar11 = obj->number;
            iVar5 = object_weight_one(obj);
            pwVar1 = &player->upkeep->total_weight;
            *pwVar1 = *pwVar1 + (int)iVar5 * (uint)bVar11;
          }
LAB_0013401f:
          object_touch(player,obj);
          _Var4 = object_is_equipped(player->body,obj);
          if (_Var4) {
            if (obj->known == (object *)0x0) {
              __assert_fail("obj->known",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/cmd-wizard.c"
                            ,0x6de,"void do_cmd_wiz_play_item(struct command *)");
            }
            pbVar2 = &obj->known->notice;
            *pbVar2 = *pbVar2 & 0xfe;
            object_learn_on_wield(player,obj);
          }
          wiz_play_item_standard_upkeep(player,obj);
        }
        pcVar13 = (char *)0x0;
        goto LAB_001341ad;
      }
      if ((ch != 'C') && (ch != 'c')) {
        if (ch != 'a') goto switchD_00133f24_caseD_6c;
        goto LAB_00133f8c;
      }
      c = CMD_WIZ_CURSE_ITEM;
      break;
    }
  }
  eVar9 = cmdq_push(c);
  if (eVar9 == 0) {
    pcVar10 = cmdq_peek();
    cmd_set_arg_item(pcVar10,"item",obj);
    cmd_00 = (command *)cmdq_peek();
    pcVar12 = "update";
    wVar7 = L'\0';
LAB_00134118:
    cmd_set_arg_choice((command_conflict *)cmd_00,pcVar12,wVar7);
switchD_00133f24_caseD_6c:
    eVar9 = cmdq_push_copy((command_conflict *)cmd);
    if (eVar9 == 0) {
      return;
    }
    pcVar13 = "Couldn\'t queue command.  Changes lost.";
  }
  else {
LAB_001340c9:
    _Var4 = get_check("Couldn\'t proceed.  Stop playing with item and lose all changes? ");
    if (!_Var4) goto switchD_00133f24_caseD_6c;
    pcVar12 = "Bailed out.  Changes to item lost.";
LAB_00133f36:
    pcVar13 = (char *)0x0;
    if (object_changed != L'\0') {
      pcVar13 = pcVar12;
    }
  }
  if (object_changed != L'\0') {
    local_38 = obj->prev;
    poStack_30 = obj->next;
    mem_free(obj->slays);
    obj->slays = (_Bool *)0x0;
    mem_free(obj->brands);
    obj->brands = (_Bool *)0x0;
    mem_free(obj->curses);
    obj->curses = (curse_data *)0x0;
    object_copy(obj,orig_obj);
    obj->prev = local_38;
    obj->next = poStack_30;
  }
LAB_001341ad:
  object_delete((chunk *)cave,(chunk *)player->cave,&orig_obj);
  cmd_set_arg_item((command_conflict *)cmd,"original_item",(object *)0x0);
  cmd_set_arg_choice((command_conflict *)cmd,"changed",L'\0');
  screen_load();
  if (pcVar13 != (char *)0x0) {
    msg("%s",pcVar13);
  }
  return;
}

Assistant:

void do_cmd_wiz_play_item(struct command *cmd)
{
	struct object *obj = NULL;
	struct object *orig_obj = NULL;
	int display_all_prop = 1;
	int object_changed = 0;
	bool done = false;
	bool rejected = true;
	const char *done_msg = NULL;
	char ch;

	/*
	 * When called to initiate a play session, "item" may be set, but
	 * "original_item" should not be set or should be set to NULL.
	 * Subsequent calls in the same session will have both set to
	 * non-NULL vales along with "all_prop" and "changed".
	 */
	if (cmd_get_arg_item(cmd, "original_item", &orig_obj) == CMD_OK &&
			orig_obj) {
		if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK || !obj) {
			assert(0);
			return;
		}
		if (cmd_get_arg_choice(cmd, "all_prop", &display_all_prop) !=
				CMD_OK) {
			assert(0);
			return;
		}
		if (cmd_get_arg_choice(cmd, "changed", &object_changed) !=
				CMD_OK) {
			assert(0);
			return;
		}
	} else {
		if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK || !obj) {
			if (!get_item(&obj, "Play with which object? ",
					"You have nothing to play with.",
					cmd->code, NULL, (USE_EQUIP |
					USE_INVEN | USE_QUIVER | USE_FLOOR))) {
				return;
			}
		}

		/* Remember the object. */
		cmd_set_arg_item(cmd, "item", obj);

		/* Make a copy so changes can be rejected. */
		orig_obj = object_new();
		object_copy(orig_obj, obj);
		cmd_set_arg_item(cmd, "original_item", orig_obj);

		/*
		 * Store whether all properties are shown or only the known
		 * ones.
		 */
		if (cmd_get_arg_choice(cmd, "all_prop", &display_all_prop) !=
				CMD_OK) {
			display_all_prop = 1;
			cmd_set_arg_choice(cmd, "all_prop", display_all_prop);
		}

		/*
		 * Store whether the working item may have changed from the
		 * original.
		 */
		if (cmd_get_arg_choice(cmd, "changed", &object_changed) !=
				CMD_OK) {
			object_changed = 0;
			cmd_set_arg_choice(cmd, "changed", object_changed);
		}

		/* Save screen. */
		screen_save();
	}

	/* Display the (possibly modified) item. */
	wiz_display_item(obj, display_all_prop != 0, player);

	/* Get choice. */
	if (get_com("[a]ccept [s]tatistics [r]eroll [t]weak [c]urse [q]uantity [k]nown? ", &ch)) {
		bool queue_failed = false;

		switch (ch) {
			case 'A':
			case 'a':
				/* Accept whatever changes were made. */
				done = true;
				rejected = false;
				if (object_changed) {
					/* Mark for updates. */
					if (object_is_carried(player, obj)
							&& (obj->number !=
							orig_obj->number
							|| object_weight_one(obj)
							!= object_weight_one(orig_obj))) {
						/*
						 * Remove the weight of the old
						 * version.
						 */
						player->upkeep->total_weight -=
							orig_obj->number
							* object_weight_one(orig_obj);

						/*
						 * Add the weight of the new
						 * version.
						 */
						player->upkeep->total_weight +=
							obj->number
							* object_weight_one(obj);
					}
					object_touch(player, obj);
					if (object_is_equipped(player->body, obj)) {
						assert(obj->known);
						obj->known->notice &=
							~OBJ_NOTICE_WORN;
						object_learn_on_wield(player,
							obj);
					}
					wiz_play_item_standard_upkeep(player,
						obj);
				}
				break;

			case 'C':
			case 'c':
				/* Change a curse on the item. */
				if (cmdq_push(CMD_WIZ_CURSE_ITEM) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
					cmd_set_arg_choice(cmdq_peek(),
						"update", 0);
				} else {
					queue_failed = true;
				}
				break;

			case 'S':
			case 's':
				/* Get statistics about the item. */
				if (cmdq_push(CMD_WIZ_STAT_ITEM) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
				} else {
					queue_failed = true;
				}
				break;

			case 'R':
			case 'r':
				/* Reroll the item. */
				if (cmdq_push(CMD_WIZ_REROLL_ITEM) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
					cmd_set_arg_choice(cmdq_peek(),
						"update", 0);
				} else {
					queue_failed = true;
				}
				break;

			case 'T':
			case 't':
				/* Tweak the object's properties. */
				if (cmdq_push(CMD_WIZ_TWEAK_ITEM) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
					cmd_set_arg_choice(cmdq_peek(),
						"update", 0);
				} else {
					queue_failed = true;
				}
				break;

			case 'K':
			case 'k':
				/* Toggle whether showing all properties. */
				display_all_prop = !display_all_prop;
				cmd_set_arg_choice(cmd, "all_prop",
					display_all_prop);
				break;

			case 'Q':
			case 'q':
				/* Change the number of items in the stack. */
				if (cmdq_push(CMD_WIZ_CHANGE_ITEM_QUANTITY) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
					cmd_set_arg_choice(cmdq_peek(),
						"update", 0);
				} else {
					queue_failed = true;
				}
				break;

			default:
				/*
				 * Don't have to do anything, next pass through
				 * will ask again what's wanted.
				 */
				break;
		}

		if (queue_failed &&
				get_check("Couldn't proceed.  Stop playing with item and lose all changes? ")) {
			done = true;
			if (object_changed) {
				done_msg = "Bailed out.  Changes to item lost.";
			}
		}
	} else {
		done = true;
		if (object_changed) {
			done_msg = "Changes ignored.";
		}
	}

	if (!done) {
		/* Push the command back on the queue to be reexecuted. */
		if (cmdq_push_copy(cmd) != 0) {
			/* Failed.  Bail out without saving changes. */
			done = true;
			done_msg = "Couldn't queue command.  Changes lost.";
		}
	}

	if (done) {
		if (rejected && object_changed) {
			/*
			 * Restore to the original values.  The pile links
			 * require special handling because object_copy()
			 * resets them.
			 */
			struct object *prev = obj->prev;
			struct object *next = obj->next;

			/* Free slays, brands, and curses by hand. */
			mem_free(obj->slays);
			obj->slays = NULL;
			mem_free(obj->brands);
			obj->brands = NULL;
			mem_free(obj->curses);
			obj->curses = NULL;

			object_copy(obj, orig_obj);
			obj->prev = prev;
			obj->next = next;
		}

		/* Release the preserved copy. */
		object_delete(cave, player->cave, &orig_obj);

		/*
		 * Reset the original_item and changed arguments so repeating
		 * the command will start a new play session without a
		 * dangling reference to the deleted preserved copy.
		 */
		cmd_set_arg_item(cmd, "original_item", NULL);
		cmd_set_arg_choice(cmd, "changed", 0);

		/* Restore the screen. */
		screen_load();

		/* Provide some feedback. */
		if (done_msg) {
			msg("%s", done_msg);
		}
	}
}